

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iteratedhash.hpp
# Opt level: O3

void __thiscall
crypto::iterated_hash<crypto::sha1_transform>::update
          (iterated_hash<crypto::sha1_transform> *this,char *data,size_t length)

{
  long lVar1;
  uint uVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  ulong uVar38;
  long lVar39;
  size_t __n;
  char *pcVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  hash_word aligned_buffer [16];
  undefined4 local_78;
  char acStack_74 [68];
  
  uVar2 = this->count_lo;
  this->count_lo = (uint)length + uVar2;
  this->count_hi = this->count_hi + (int)(length >> 0x20) + (uint)CARRY4((uint)length,uVar2);
  uVar38 = (ulong)uVar2 & 0x3f;
  if ((uVar2 & 0x3f) != 0) {
    if (uVar38 + length < 0x40) {
      memcpy(this->buffer + uVar38,data,length);
      return;
    }
    __n = 0x40 - uVar38;
    memcpy(this->buffer + uVar38,data,__n);
    lVar39 = 0;
    do {
      auVar42 = *(undefined1 (*) [16])(this->buffer + lVar39 * 4);
      auVar44[1] = 0;
      auVar44[0] = auVar42[8];
      auVar44[2] = auVar42[9];
      auVar44[3] = 0;
      auVar44[4] = auVar42[10];
      auVar44[5] = 0;
      auVar44[6] = auVar42[0xb];
      auVar44[7] = 0;
      auVar44[8] = auVar42[0xc];
      auVar44[9] = 0;
      auVar44[10] = auVar42[0xd];
      auVar44[0xb] = 0;
      auVar44[0xc] = auVar42[0xe];
      auVar44[0xd] = 0;
      auVar44[0xe] = auVar42[0xf];
      auVar44[0xf] = 0;
      auVar44 = pshuflw(auVar44,auVar44,0x1b);
      auVar44 = pshufhw(auVar44,auVar44,0x1b);
      auVar19[0xd] = 0;
      auVar19._0_13_ = auVar42._0_13_;
      auVar19[0xe] = auVar42[7];
      auVar20[0xc] = auVar42[6];
      auVar20._0_12_ = auVar42._0_12_;
      auVar20._13_2_ = auVar19._13_2_;
      auVar21[0xb] = 0;
      auVar21._0_11_ = auVar42._0_11_;
      auVar21._12_3_ = auVar20._12_3_;
      auVar23[10] = auVar42[5];
      auVar23._0_10_ = auVar42._0_10_;
      auVar23._11_4_ = auVar21._11_4_;
      auVar25[9] = 0;
      auVar25._0_9_ = auVar42._0_9_;
      auVar25._10_5_ = auVar23._10_5_;
      auVar27[8] = auVar42[4];
      auVar27._0_8_ = auVar42._0_8_;
      auVar27._9_6_ = auVar25._9_6_;
      auVar32._7_8_ = 0;
      auVar32._0_7_ = auVar27._8_7_;
      auVar34._1_8_ = SUB158(auVar32 << 0x40,7);
      auVar34[0] = auVar42[3];
      auVar34._9_6_ = 0;
      auVar35._1_10_ = SUB1510(auVar34 << 0x30,5);
      auVar35[0] = auVar42[2];
      auVar35._11_4_ = 0;
      auVar31[2] = auVar42[1];
      auVar31._0_2_ = auVar42._0_2_;
      auVar31._3_12_ = SUB1512(auVar35 << 0x20,3);
      auVar42._0_2_ = auVar42._0_2_ & 0xff;
      auVar42._2_13_ = auVar31._2_13_;
      auVar42[0xf] = 0;
      auVar42 = pshuflw(auVar42,auVar42,0x1b);
      auVar42 = pshufhw(auVar42,auVar42,0x1b);
      sVar3 = auVar42._0_2_;
      sVar4 = auVar42._2_2_;
      sVar5 = auVar42._4_2_;
      sVar6 = auVar42._6_2_;
      sVar7 = auVar42._8_2_;
      sVar8 = auVar42._10_2_;
      sVar9 = auVar42._12_2_;
      sVar10 = auVar42._14_2_;
      sVar11 = auVar44._0_2_;
      sVar12 = auVar44._2_2_;
      sVar13 = auVar44._4_2_;
      sVar14 = auVar44._6_2_;
      sVar15 = auVar44._8_2_;
      sVar16 = auVar44._10_2_;
      sVar17 = auVar44._12_2_;
      sVar18 = auVar44._14_2_;
      lVar1 = lVar39 * 4;
      *(char *)(&local_78 + lVar39) = (0 < sVar3) * (sVar3 < 0x100) * auVar42[0] - (0xff < sVar3);
      *(char *)((long)&local_78 + lVar1 + 1) =
           (0 < sVar4) * (sVar4 < 0x100) * auVar42[2] - (0xff < sVar4);
      *(char *)((long)&local_78 + lVar1 + 2) =
           (0 < sVar5) * (sVar5 < 0x100) * auVar42[4] - (0xff < sVar5);
      *(char *)((long)&local_78 + lVar1 + 3) =
           (0 < sVar6) * (sVar6 < 0x100) * auVar42[6] - (0xff < sVar6);
      acStack_74[lVar1] = (0 < sVar7) * (sVar7 < 0x100) * auVar42[8] - (0xff < sVar7);
      acStack_74[lVar1 + 1] = (0 < sVar8) * (sVar8 < 0x100) * auVar42[10] - (0xff < sVar8);
      acStack_74[lVar1 + 2] = (0 < sVar9) * (sVar9 < 0x100) * auVar42[0xc] - (0xff < sVar9);
      acStack_74[lVar1 + 3] = (0 < sVar10) * (sVar10 < 0x100) * auVar42[0xe] - (0xff < sVar10);
      acStack_74[lVar1 + 4] = (0 < sVar11) * (sVar11 < 0x100) * auVar44[0] - (0xff < sVar11);
      acStack_74[lVar1 + 5] = (0 < sVar12) * (sVar12 < 0x100) * auVar44[2] - (0xff < sVar12);
      acStack_74[lVar1 + 6] = (0 < sVar13) * (sVar13 < 0x100) * auVar44[4] - (0xff < sVar13);
      acStack_74[lVar1 + 7] = (0 < sVar14) * (sVar14 < 0x100) * auVar44[6] - (0xff < sVar14);
      acStack_74[lVar1 + 8] = (0 < sVar15) * (sVar15 < 0x100) * auVar44[8] - (0xff < sVar15);
      acStack_74[lVar1 + 9] = (0 < sVar16) * (sVar16 < 0x100) * auVar44[10] - (0xff < sVar16);
      acStack_74[lVar1 + 10] = (0 < sVar17) * (sVar17 < 0x100) * auVar44[0xc] - (0xff < sVar17);
      acStack_74[lVar1 + 0xb] = (0 < sVar18) * (sVar18 < 0x100) * auVar44[0xe] - (0xff < sVar18);
      lVar39 = lVar39 + 4;
    } while (lVar39 != 0x10);
    sha1_transform::transform(this->state,&local_78);
    data = data + __n;
    length = length - __n;
  }
  if (0x3f < length) {
    uVar38 = length;
    pcVar40 = data;
    do {
      lVar39 = 0;
      do {
        auVar42 = *(undefined1 (*) [16])(pcVar40 + lVar39 * 4);
        auVar43[1] = 0;
        auVar43[0] = auVar42[8];
        auVar43[2] = auVar42[9];
        auVar43[3] = 0;
        auVar43[4] = auVar42[10];
        auVar43[5] = 0;
        auVar43[6] = auVar42[0xb];
        auVar43[7] = 0;
        auVar43[8] = auVar42[0xc];
        auVar43[9] = 0;
        auVar43[10] = auVar42[0xd];
        auVar43[0xb] = 0;
        auVar43[0xc] = auVar42[0xe];
        auVar43[0xd] = 0;
        auVar43[0xe] = auVar42[0xf];
        auVar43[0xf] = 0;
        auVar44 = pshuflw(auVar43,auVar43,0x1b);
        auVar44 = pshufhw(auVar44,auVar44,0x1b);
        auVar22[0xd] = 0;
        auVar22._0_13_ = auVar42._0_13_;
        auVar22[0xe] = auVar42[7];
        auVar24[0xc] = auVar42[6];
        auVar24._0_12_ = auVar42._0_12_;
        auVar24._13_2_ = auVar22._13_2_;
        auVar26[0xb] = 0;
        auVar26._0_11_ = auVar42._0_11_;
        auVar26._12_3_ = auVar24._12_3_;
        auVar28[10] = auVar42[5];
        auVar28._0_10_ = auVar42._0_10_;
        auVar28._11_4_ = auVar26._11_4_;
        auVar29[9] = 0;
        auVar29._0_9_ = auVar42._0_9_;
        auVar29._10_5_ = auVar28._10_5_;
        auVar30[8] = auVar42[4];
        auVar30._0_8_ = auVar42._0_8_;
        auVar30._9_6_ = auVar29._9_6_;
        auVar33._7_8_ = 0;
        auVar33._0_7_ = auVar30._8_7_;
        auVar36._1_8_ = SUB158(auVar33 << 0x40,7);
        auVar36[0] = auVar42[3];
        auVar36._9_6_ = 0;
        auVar37._1_10_ = SUB1510(auVar36 << 0x30,5);
        auVar37[0] = auVar42[2];
        auVar37._11_4_ = 0;
        auVar41._3_12_ = SUB1512(auVar37 << 0x20,3);
        auVar41[2] = auVar42[1];
        auVar41[0] = auVar42[0];
        auVar41[1] = 0;
        auVar41[0xf] = 0;
        auVar42 = pshuflw(auVar41,auVar41,0x1b);
        auVar42 = pshufhw(auVar42,auVar42,0x1b);
        sVar3 = auVar42._0_2_;
        sVar4 = auVar42._2_2_;
        sVar5 = auVar42._4_2_;
        sVar6 = auVar42._6_2_;
        sVar7 = auVar42._8_2_;
        sVar8 = auVar42._10_2_;
        sVar9 = auVar42._12_2_;
        sVar10 = auVar42._14_2_;
        sVar11 = auVar44._0_2_;
        sVar12 = auVar44._2_2_;
        sVar13 = auVar44._4_2_;
        sVar14 = auVar44._6_2_;
        sVar15 = auVar44._8_2_;
        sVar16 = auVar44._10_2_;
        sVar17 = auVar44._12_2_;
        sVar18 = auVar44._14_2_;
        lVar1 = lVar39 * 4;
        *(char *)(&local_78 + lVar39) = (0 < sVar3) * (sVar3 < 0x100) * auVar42[0] - (0xff < sVar3);
        *(char *)((long)&local_78 + lVar1 + 1) =
             (0 < sVar4) * (sVar4 < 0x100) * auVar42[2] - (0xff < sVar4);
        *(char *)((long)&local_78 + lVar1 + 2) =
             (0 < sVar5) * (sVar5 < 0x100) * auVar42[4] - (0xff < sVar5);
        *(char *)((long)&local_78 + lVar1 + 3) =
             (0 < sVar6) * (sVar6 < 0x100) * auVar42[6] - (0xff < sVar6);
        acStack_74[lVar1] = (0 < sVar7) * (sVar7 < 0x100) * auVar42[8] - (0xff < sVar7);
        acStack_74[lVar1 + 1] = (0 < sVar8) * (sVar8 < 0x100) * auVar42[10] - (0xff < sVar8);
        acStack_74[lVar1 + 2] = (0 < sVar9) * (sVar9 < 0x100) * auVar42[0xc] - (0xff < sVar9);
        acStack_74[lVar1 + 3] = (0 < sVar10) * (sVar10 < 0x100) * auVar42[0xe] - (0xff < sVar10);
        acStack_74[lVar1 + 4] = (0 < sVar11) * (sVar11 < 0x100) * auVar44[0] - (0xff < sVar11);
        acStack_74[lVar1 + 5] = (0 < sVar12) * (sVar12 < 0x100) * auVar44[2] - (0xff < sVar12);
        acStack_74[lVar1 + 6] = (0 < sVar13) * (sVar13 < 0x100) * auVar44[4] - (0xff < sVar13);
        acStack_74[lVar1 + 7] = (0 < sVar14) * (sVar14 < 0x100) * auVar44[6] - (0xff < sVar14);
        acStack_74[lVar1 + 8] = (0 < sVar15) * (sVar15 < 0x100) * auVar44[8] - (0xff < sVar15);
        acStack_74[lVar1 + 9] = (0 < sVar16) * (sVar16 < 0x100) * auVar44[10] - (0xff < sVar16);
        acStack_74[lVar1 + 10] = (0 < sVar17) * (sVar17 < 0x100) * auVar44[0xc] - (0xff < sVar17);
        acStack_74[lVar1 + 0xb] = (0 < sVar18) * (sVar18 < 0x100) * auVar44[0xe] - (0xff < sVar18);
        lVar39 = lVar39 + 4;
      } while (lVar39 != 0x10);
      sha1_transform::transform(this->state,&local_78);
      pcVar40 = pcVar40 + 0x40;
      uVar38 = uVar38 - 0x40;
    } while (0x3f < uVar38);
    data = data + (length - uVar38);
    length = uVar38;
  }
  if (length != 0) {
    memcpy(this,data,length);
  }
  return;
}

Assistant:

void iterated_hash<T>::update(const char * data, size_t length) {
	
	hash_word old_count_lo = count_lo;
	
	if((count_lo = old_count_lo + hash_word(length)) < old_count_lo) {
		count_hi++; // carry from low to high
	}
	
	count_hi += hash_word(util::safe_right_shift<8 * sizeof(hash_word)>(length));
	
	size_t num = util::mod_power_of_2(old_count_lo, size_t(block_size));
	
	if(num != 0) { // process left over data
		if(num + length >= block_size) {
			std::memcpy(buffer + num, data, block_size - num);
			hash(state, buffer, block_size);
			data += (block_size - num);
			length -= (block_size - num);
			// drop through and do the rest
		} else {
			std::memcpy(buffer + num, data, length);
			return;
		}
	}
	
	// now process the input data in blocks of BlockSize bytes and save the leftovers to m_data
	if(length >= block_size) {
		size_t left_over = hash(state, data, length);
		data += (length - left_over);
		length = left_over;
	}
	
	if(length) {
		memcpy(buffer, data, length);
	}
}